

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanePart.cpp
# Opt level: O2

void __thiscall PlanePart::next(PlanePart *this,bool action)

{
  int iVar1;
  long lVar2;
  bool *pbVar3;
  bool bVar4;
  double dVar5;
  vector<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
  PlanePartWithProba;
  
  nextPlanePartPossible(&PlanePartWithProba,this,action);
  iVar1 = rand();
  dVar5 = (double)iVar1 / 2147483647.0;
  lVar2 = ((long)PlanePartWithProba.
                 super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)PlanePartWithProba.
                super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x38;
  pbVar3 = &((PlanePartWithProba.
              super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->second).whichPente;
  do {
    bVar4 = lVar2 == 0;
    lVar2 = lVar2 + -1;
    if (bVar4) {
LAB_00101451:
      std::
      _Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>::
      ~_Vector_base(&PlanePartWithProba.
                     super__Vector_base<std::pair<double,_PlanePart>,_std::allocator<std::pair<double,_PlanePart>_>_>
                   );
      return;
    }
    if (dVar5 <= *(double *)(pbVar3 + -0x30)) {
      this->frequency = *(double *)(pbVar3 + -8);
      this->whichPente = *pbVar3;
      goto LAB_00101451;
    }
    dVar5 = dVar5 - *(double *)(pbVar3 + -0x30);
    pbVar3 = pbVar3 + 0x38;
  } while( true );
}

Assistant:

void PlanePart::next(bool action) {
    vector<pair<double,PlanePart>> PlanePartWithProba = nextPlanePartPossible(action);
    double probaChoice = (double) rand() / RAND_MAX;

    // On boucle sur toute les pièces du vecteur pour déterminer laquelle on choisit
    for (int i = 0; i < PlanePartWithProba.size(); i ++) {
        if (probaChoice - PlanePartWithProba[i].first > 0) {
            probaChoice -= PlanePartWithProba[i].first;
        }
        else {
            frequency = PlanePartWithProba[i].second.frequency;
            whichPente = PlanePartWithProba[i].second.whichPente;
            return;
        }
    }
}